

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_StdioFile.cc
# Opt level: O3

void __thiscall Pl_StdioFile::~Pl_StdioFile(Pl_StdioFile *this)

{
  Members *pMVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_StdioFile_002ea7f0;
  pMVar1 = (this->m)._M_t.
           super___uniq_ptr_impl<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>
           ._M_t.
           super__Tuple_impl<0UL,_Pl_StdioFile::Members_*,_std::default_delete<Pl_StdioFile::Members>_>
           .super__Head_base<0UL,_Pl_StdioFile::Members_*,_false>._M_head_impl;
  if (pMVar1 != (Members *)0x0) {
    operator_delete(pMVar1,8);
  }
  (this->m)._M_t.
  super___uniq_ptr_impl<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>._M_t.
  super__Tuple_impl<0UL,_Pl_StdioFile::Members_*,_std::default_delete<Pl_StdioFile::Members>_>.
  super__Head_base<0UL,_Pl_StdioFile::Members_*,_false>._M_head_impl = (Members *)0x0;
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002ea020;
  pcVar2 = (this->super_Pipeline).identifier._M_dataplus._M_p;
  paVar3 = &(this->super_Pipeline).identifier.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

void
Pl_StdioFile::write(unsigned char const* buf, size_t len)
{
    size_t so_far = 0;
    while (len > 0) {
        so_far = fwrite(buf, 1, len, m->file);
        if (so_far == 0) {
            QUtil::throw_system_error(this->identifier + ": Pl_StdioFile::write");
        } else {
            buf += so_far;
            len -= so_far;
        }
    }
}